

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

Address * __thiscall
cfd::AddressFactory::CreateAddress
          (Address *__return_storage_ptr__,AddressFactory *this,AddressType address_type,
          Pubkey *pubkey,Script *script,Script *locking_script,Script *redeem_script)

{
  bool bVar1;
  CfdException *pCVar2;
  AddressType address_type_local;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  Script temp_script;
  undefined1 local_1a8 [376];
  
  address_type_local = address_type;
  if ((((pubkey == (Pubkey *)0x0) || (bVar1 = core::Pubkey::IsValid(pubkey), !bVar1)) &&
      (address_type < kWitnessUnknown)) && ((0xd4U >> (address_type & 0x1f) & 1) != 0)) {
    local_1a8._0_8_ = "cfd_address.cpp";
    local_1a8._8_4_ = 0xe4;
    local_1a8._16_8_ = (long)"CfdCreateAddress" + 3;
    core::logger::warn<>
              ((CfdSourceLocation *)local_1a8,
               "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_1a8,"pubkey hex is empty.",(allocator *)&temp_script);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (((script == (Script *)0x0) || (bVar1 = core::Script::IsEmpty(script), bVar1)) &&
     ((address_type < kP2shP2wpkhAddress && ((0x2aU >> (address_type & 0x1f) & 1) != 0)))) {
    local_1a8._0_8_ = "cfd_address.cpp";
    local_1a8._8_4_ = 0xef;
    local_1a8._16_8_ = (long)"CfdCreateAddress" + 3;
    core::logger::warn<>
              ((CfdSourceLocation *)local_1a8,
               "Failed to CreateAddress. Invalid script hex: script is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_1a8,"script hex is empty.",(allocator *)&temp_script);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::Address::Address(__return_storage_ptr__);
  core::Script::Script(&temp_script);
  switch(address_type) {
  case kP2shAddress:
    CreateP2shAddress((Address *)local_1a8,this,script);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    break;
  case kP2pkhAddress:
    CreateP2pkhAddress((Address *)local_1a8,this,pubkey);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    break;
  case kP2wshAddress:
    CreateP2wshAddress((Address *)local_1a8,this,script);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    break;
  case kP2wpkhAddress:
    CreateP2wpkhAddress((Address *)local_1a8,this,pubkey);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    break;
  case kP2shP2wshAddress:
    core::ScriptUtil::CreateP2wshLockingScript((Script *)local_1a8,script);
    core::Script::operator=(&temp_script,(Script *)local_1a8);
    core::Script::~Script((Script *)local_1a8);
    CreateP2shAddress((Address *)local_1a8,this,&temp_script);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    goto LAB_0032ef65;
  case kP2shP2wpkhAddress:
    core::ScriptUtil::CreateP2wpkhLockingScript((Script *)local_1a8,pubkey);
    core::Script::operator=(&temp_script,(Script *)local_1a8);
    core::Script::~Script((Script *)local_1a8);
    CreateP2shAddress((Address *)local_1a8,this,&temp_script);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
LAB_0032ef65:
    core::Address::~Address((Address *)local_1a8);
    if (redeem_script != (Script *)0x0) {
      core::Script::operator=(redeem_script,&temp_script);
    }
    goto LAB_0032efc5;
  case kTaprootAddress:
    core::SchnorrPubkey::FromPubkey((SchnorrPubkey *)&local_1f8,pubkey,(bool *)0x0);
    CreateTaprootAddress((Address *)local_1a8,this,(SchnorrPubkey *)&local_1f8);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1a8);
    core::Address::~Address((Address *)local_1a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f8);
    goto LAB_0032efc5;
  default:
    local_1a8._0_8_ = "cfd_address.cpp";
    local_1a8._8_4_ = 0x118;
    local_1a8._16_8_ = (long)"CfdCreateAddress" + 3;
    core::logger::warn<cfd::core::AddressType&>
              ((CfdSourceLocation *)local_1a8,
               "Failed to CreateAddress. Invalid address type:  address_type={}",&address_type_local
              );
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_1a8,
               "Invalid address_type. address_type must be \"p2pkh\" or \"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or \"p2sh-p2wsh\"."
               ,(allocator *)&local_1f8);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::Address::~Address((Address *)local_1a8);
LAB_0032efc5:
  if (locking_script != (Script *)0x0) {
    core::Address::GetLockingScript((Script *)local_1a8,__return_storage_ptr__);
    core::Script::operator=(locking_script,(Script *)local_1a8);
    core::Script::~Script((Script *)local_1a8);
  }
  core::Script::~Script(&temp_script);
  return __return_storage_ptr__;
}

Assistant:

Address AddressFactory::CreateAddress(
    AddressType address_type, const Pubkey* pubkey, const Script* script,
    Script* locking_script, Script* redeem_script) const {
  if ((pubkey == nullptr) || (!pubkey->IsValid())) {
    if (address_type == AddressType::kP2pkhAddress ||
        address_type == AddressType::kP2wpkhAddress ||
        address_type == AddressType::kP2shP2wpkhAddress ||
        address_type == AddressType::kTaprootAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "pubkey hex is empty.");
    }
  }
  if ((script == nullptr) || (script->IsEmpty())) {
    if (address_type == AddressType::kP2shAddress ||
        address_type == AddressType::kP2wshAddress ||
        address_type == AddressType::kP2shP2wshAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid script hex: script is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "script hex is empty.");
    }
  }
  Address addr;

  Script temp_script;
  switch (address_type) {
    case AddressType::kP2pkhAddress:
      addr = CreateP2pkhAddress(*pubkey);
      break;
    case AddressType::kP2shAddress:
      addr = CreateP2shAddress(*script);
      break;
    case AddressType::kP2wpkhAddress:
      addr = CreateP2wpkhAddress(*pubkey);
      break;
    case AddressType::kP2wshAddress:
      addr = CreateP2wshAddress(*script);
      break;
    case AddressType::kP2shP2wpkhAddress:
      temp_script = ScriptUtil::CreateP2wpkhLockingScript(*pubkey);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kP2shP2wshAddress:
      temp_script = ScriptUtil::CreateP2wshLockingScript(*script);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kTaprootAddress:
      addr = CreateTaprootAddress(SchnorrPubkey::FromPubkey(*pubkey));
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid address type:  address_type={}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2pkh\" or "
          "\"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or "
          "\"p2sh-p2wsh\".");  // NOLINT
      break;
  }
  if (locking_script != nullptr) {
    *locking_script = addr.GetLockingScript();
  }

  return addr;
}